

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O1

void __thiscall PointToPoint::kernel(PointToPoint *this,int param_1,int it)

{
  uint uVar1;
  int iVar2;
  MPI_Request *ppoVar3;
  
  iVar2 = (this->super_HalosExchange).n_partners;
  if (0 < iVar2) {
    ppoVar3 = (this->super_HalosExchange).reqs;
    uVar1 = 0;
    do {
      (*(this->super_HalosExchange).super_Computation._vptr_Computation[7])
                (this,(ulong)uVar1,ppoVar3,ppoVar3 + 1,0);
      uVar1 = uVar1 + 1;
      iVar2 = (this->super_HalosExchange).n_partners;
      ppoVar3 = ppoVar3 + 2;
    } while ((int)uVar1 < iVar2);
  }
  MPI_Waitall(iVar2 * 2,(this->super_HalosExchange).reqs,0);
  return;
}

Assistant:

inline void kernel(int, int it) override
    {
#ifdef DEBUG_MODE
        fill_sbuf(it);
#endif
        // pointer to the first request.
        auto* rq = reqs;
        for (int i = 0; i < n_partners; i++)
        {
            // As long as there is a waitall between iterations, we do not need
            // to use incremental tags across iterations.
            sendrecv(i, rq, rq + 1, 0);
            rq += 2;
        }

        MPI_Waitall(2 * n_partners, reqs, MPI_STATUSES_IGNORE);
#ifdef DEBUG_MODE
        for (int i = 0; i < n_partners; i++)
            check_rbuf(i, it);
#endif
    }